

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Creature.cpp
# Opt level: O0

double __thiscall Creature::make_fitness(Creature *this)

{
  shared_count sVar1;
  int iVar2;
  World *pWVar3;
  sp_counted_base *psVar4;
  reference r;
  type pCVar5;
  genes_t *this_00;
  size_type sVar6;
  undefined4 extraout_var;
  double dVar7;
  double local_90;
  any local_88;
  double local_80;
  any local_78;
  undefined1 local_70 [8];
  vector<boost::any,_std::allocator<boost::any>_> av;
  ulong local_48;
  size_t i;
  shared_ptr<Chromosome> chr;
  size_t h;
  double ret;
  World *wld;
  Creature *this_local;
  
  if (this->pntpop == (Population *)0x0) {
    this_local = (Creature *)0x0;
  }
  else {
    pWVar3 = Population::get_world(this->pntpop);
    if (pWVar3 == (World *)0x0) {
      this_local = (Creature *)0x0;
    }
    else {
      h = 0;
      chr.pn.pi_ = (sp_counted_base *)0x0;
      while( true ) {
        sVar1.pi_ = chr.pn.pi_;
        psVar4 = (sp_counted_base *)
                 std::
                 vector<boost::shared_ptr<Chromosome>,_std::allocator<boost::shared_ptr<Chromosome>_>_>
                 ::size(&this->chroms);
        if (psVar4 <= sVar1.pi_) break;
        r = std::
            vector<boost::shared_ptr<Chromosome>,_std::allocator<boost::shared_ptr<Chromosome>_>_>::
            operator[](&this->chroms,(size_type)chr.pn.pi_);
        boost::shared_ptr<Chromosome>::shared_ptr((shared_ptr<Chromosome> *)&i,r);
        local_48 = 0;
        while( true ) {
          pCVar5 = boost::shared_ptr<Chromosome>::operator->((shared_ptr<Chromosome> *)&i);
          this_00 = Chromosome::get_genes(pCVar5);
          sVar6 = std::vector<std::bitset<50UL>,_std::allocator<std::bitset<50UL>_>_>::size(this_00)
          ;
          if (sVar6 <= local_48) break;
          std::vector<boost::any,_std::allocator<boost::any>_>::vector
                    ((vector<boost::any,_std::allocator<boost::any>_> *)local_70);
          local_80 = get_phenotype(this,(size_t)chr.pn.pi_,local_48,0);
          boost::any::any<double>(&local_78,&local_80,(type *)0x0,(type *)0x0);
          std::vector<boost::any,_std::allocator<boost::any>_>::push_back
                    ((vector<boost::any,_std::allocator<boost::any>_> *)local_70,&local_78);
          boost::any::~any(&local_78);
          sVar1 = chr.pn;
          pCVar5 = boost::shared_ptr<Chromosome>::operator->((shared_ptr<Chromosome> *)&i);
          local_90 = get_phenotype(this,(size_t)sVar1.pi_,local_48,pCVar5->ALLELE_SIZE);
          boost::any::any<double>(&local_88,&local_90,(type *)0x0,(type *)0x0);
          std::vector<boost::any,_std::allocator<boost::any>_>::push_back
                    ((vector<boost::any,_std::allocator<boost::any>_> *)local_70,&local_88);
          boost::any::~any(&local_88);
          iVar2 = (*pWVar3->_vptr_World[6])();
          dVar7 = (double)(*(code *)CONCAT44(extraout_var,iVar2))(local_70);
          h = (size_t)(dVar7 + (double)h);
          std::vector<boost::any,_std::allocator<boost::any>_>::~vector
                    ((vector<boost::any,_std::allocator<boost::any>_> *)local_70);
          local_48 = local_48 + 1;
        }
        boost::shared_ptr<Chromosome>::~shared_ptr((shared_ptr<Chromosome> *)&i);
        chr.pn.pi_ = (sp_counted_base *)((long)&(chr.pn.pi_)->_vptr_sp_counted_base + 1);
      }
      this_local = (Creature *)h;
    }
  }
  return (double)this_local;
}

Assistant:

double Creature::make_fitness()
{
	if(!pntpop)
		return 0;

	const World* wld = pntpop->get_world();
	if(!wld)
		return 0;

	double ret = 0;

	for(size_t h = 0; h < chroms.size(); ++h)
	{
		boost::shared_ptr<Chromosome> chr = chroms[h];

		for(size_t i = 0; i < chr->get_genes().size(); ++i)
		{
			std::vector<any> av;
			av.push_back(get_phenotype(h, i, 0));
			av.push_back(get_phenotype(h, i, chr->ALLELE_SIZE));

			ret += (wld->get_fitfun())(av);
		}
	}

	return ret;

}